

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_receive_raw_frame
              (AV1_COMP *cpi,aom_enc_frame_flags_t frame_flags,YV12_BUFFER_CONFIG *sd,
              int64_t time_stamp,int64_t end_time)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  YV12_BUFFER_CONFIG *in_RCX;
  long in_RDX;
  long in_RDI;
  double *in_R8;
  double y_noise_level;
  int use_highbitdepth;
  int subsampling_y;
  int subsampling_x;
  int res;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  _Bool in_stack_000000bb;
  int in_stack_000000bc;
  int64_t in_stack_000000c0;
  int64_t in_stack_000000c8;
  YV12_BUFFER_CONFIG *in_stack_000000d0;
  lookahead_ctx *in_stack_000000d8;
  aom_enc_frame_flags_t in_stack_000000f0;
  int64_t in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffb0;
  int iVar5;
  int local_3c;
  long lVar6;
  
  lVar4 = in_RDI + 0x3bf80;
  lVar6 = *(long *)(in_RDI + 0x42008);
  local_3c = 0;
  iVar1 = *(int *)(in_RDX + 0x90);
  iVar5 = *(int *)(in_RDX + 0x94);
  uVar2 = (uint)((*(uint *)(in_RDX + 0xc0) & 8) != 0);
  if ((0.0 < *(float *)(in_RDI + 0x42714)) &&
     ((*(int *)(in_RDI + 0x42758) != 1 || (*(int *)(in_RDI + 0x4271c) != 0)))) {
    if (*(char *)(in_RDI + 0x42770) == '\x02') {
      in_stack_ffffffffffffffb0 = (YV12_BUFFER_CONFIG *)0x0;
      av1_estimate_noise_level
                (in_RCX,in_R8,(int)((ulong)lVar4 >> 0x20),(int)lVar4,(int)((ulong)lVar6 >> 0x20),
                 (int)lVar6);
      *(float *)(in_RDI + 0x42714) = (float)((double)in_stack_ffffffffffffffb0 - 0.1);
      if (0.0 <= *(float *)(in_RDI + 0x42714)) {
        in_stack_ffffffffffffffa8 = (double)*(float *)(in_RDI + 0x42714);
      }
      else {
        in_stack_ffffffffffffffa8 = 0.0;
      }
      *(float *)(in_RDI + 0x42714) = (float)in_stack_ffffffffffffffa8;
      if (0.0 < *(float *)(in_RDI + 0x42714)) {
        *(float *)(in_RDI + 0x42714) = *(float *)(in_RDI + 0x42714) + 0.5;
      }
      if (*(float *)(in_RDI + 0x42714) <= 5.0) {
        in_stack_ffffffffffffffa0 = (double)*(float *)(in_RDI + 0x42714);
      }
      else {
        in_stack_ffffffffffffffa0 = 5.0;
      }
      *(float *)(in_RDI + 0x42714) = (float)in_stack_ffffffffffffffa0;
    }
    iVar3 = apply_denoise_2d((AV1_COMP *)CONCAT44(iVar5,uVar2),in_stack_ffffffffffffffb0,
                             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                             SUB84(in_stack_ffffffffffffffa8,0),(int64_t)in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98);
    if (iVar3 < 0) {
      local_3c = -1;
    }
  }
  iVar3 = av1_lookahead_push(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0
                             ,in_stack_000000bc,in_stack_000000bb,in_stack_000000f0);
  if (iVar3 != 0) {
    aom_set_error(*(aom_internal_error_info **)(lVar4 + 0x30),AOM_CODEC_ERROR,
                  "av1_lookahead_push() failed");
    local_3c = -1;
  }
  if (((*(char *)(lVar6 + 0x45) == '\0') && (*(char *)(lVar6 + 0x4d) == '\0')) &&
     ((iVar1 != 1 || (iVar5 != 1)))) {
    aom_set_error(*(aom_internal_error_info **)(lVar4 + 0x30),AOM_CODEC_INVALID_PARAM,
                  "Non-4:2:0 color format requires profile 1 or 2");
    local_3c = -1;
  }
  if ((*(char *)(lVar6 + 0x45) == '\x01') && ((iVar1 != 0 || (iVar5 != 0)))) {
    aom_set_error(*(aom_internal_error_info **)(lVar4 + 0x30),AOM_CODEC_INVALID_PARAM,
                  "Profile 1 requires 4:4:4 color format");
    local_3c = -1;
  }
  if (((*(char *)(lVar6 + 0x45) == '\x02') && (*(uint *)(lVar6 + 0x48) < 0xb)) &&
     ((iVar1 != 1 || (iVar5 != 0)))) {
    aom_set_error(*(aom_internal_error_info **)(lVar4 + 0x30),AOM_CODEC_INVALID_PARAM,
                  "Profile 2 bit-depth <= 10 requires 4:2:2 color format");
    local_3c = -1;
  }
  return local_3c;
}

Assistant:

int av1_receive_raw_frame(AV1_COMP *cpi, aom_enc_frame_flags_t frame_flags,
                          const YV12_BUFFER_CONFIG *sd, int64_t time_stamp,
                          int64_t end_time) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  int res = 0;
  const int subsampling_x = sd->subsampling_x;
  const int subsampling_y = sd->subsampling_y;
  const int use_highbitdepth = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;

#if CONFIG_TUNE_VMAF
  if (!is_stat_generation_stage(cpi) &&
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_WITH_PREPROCESSING) {
    av1_vmaf_frame_preprocessing(cpi, sd);
  }
  if (!is_stat_generation_stage(cpi) &&
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN) {
    av1_vmaf_blk_preprocessing(cpi, sd);
  }
#endif

#if CONFIG_INTERNAL_STATS
  struct aom_usec_timer timer;
  aom_usec_timer_start(&timer);
#endif

#if CONFIG_AV1_TEMPORAL_DENOISING
  setup_denoiser_buffer(cpi);
#endif

#if CONFIG_DENOISE
  // even if denoise_noise_level is > 0, we don't need need to denoise on pass
  // 1 of 2 if enable_dnl_denoising is disabled since the 2nd pass will be
  // encoding the original (non-denoised) frame
  if (cpi->oxcf.noise_level > 0 && !(cpi->oxcf.pass == AOM_RC_FIRST_PASS &&
                                     !cpi->oxcf.enable_dnl_denoising)) {
#if !CONFIG_REALTIME_ONLY
    // Choose a synthetic noise level for still images for enhanced perceptual
    // quality based on an estimated noise level in the source, but only if
    // the noise level is set on the command line to > 0.
    if (cpi->oxcf.mode == ALLINTRA) {
      // No noise synthesis if source is very clean.
      // Uses a low edge threshold to focus on smooth areas.
      // Increase output noise setting a little compared to measured value.
      double y_noise_level = 0.0;
      av1_estimate_noise_level(sd, &y_noise_level, AOM_PLANE_Y, AOM_PLANE_Y,
                               cm->seq_params->bit_depth, 16);
      cpi->oxcf.noise_level = (float)(y_noise_level - 0.1);
      cpi->oxcf.noise_level = (float)AOMMAX(0.0, cpi->oxcf.noise_level);
      if (cpi->oxcf.noise_level > 0.0) {
        cpi->oxcf.noise_level += (float)0.5;
      }
      cpi->oxcf.noise_level = (float)AOMMIN(5.0, cpi->oxcf.noise_level);
    }

    if (apply_denoise_2d(cpi, sd, cpi->oxcf.noise_block_size,
                         cpi->oxcf.noise_level, time_stamp, end_time) < 0)
      res = -1;
#endif  // !CONFIG_REALTIME_ONLY
  }
#endif  //  CONFIG_DENOISE

  if (av1_lookahead_push(cpi->ppi->lookahead, sd, time_stamp, end_time,
                         use_highbitdepth, cpi->alloc_pyramid, frame_flags)) {
    aom_set_error(cm->error, AOM_CODEC_ERROR, "av1_lookahead_push() failed");
    res = -1;
  }
#if CONFIG_INTERNAL_STATS
  aom_usec_timer_mark(&timer);
  cpi->ppi->total_time_receive_data += aom_usec_timer_elapsed(&timer);
#endif

  // Note: Regarding profile setting, the following checks are added to help
  // choose a proper profile for the input video. The criterion is that all
  // bitstreams must be designated as the lowest profile that match its content.
  // E.G. A bitstream that contains 4:4:4 video must be designated as High
  // Profile in the seq header, and likewise a bitstream that contains 4:2:2
  // bitstream must be designated as Professional Profile in the sequence
  // header.
  if ((seq_params->profile == PROFILE_0) && !seq_params->monochrome &&
      (subsampling_x != 1 || subsampling_y != 1)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Non-4:2:0 color format requires profile 1 or 2");
    res = -1;
  }
  if ((seq_params->profile == PROFILE_1) &&
      !(subsampling_x == 0 && subsampling_y == 0)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Profile 1 requires 4:4:4 color format");
    res = -1;
  }
  if ((seq_params->profile == PROFILE_2) &&
      (seq_params->bit_depth <= AOM_BITS_10) &&
      !(subsampling_x == 1 && subsampling_y == 0)) {
    aom_set_error(cm->error, AOM_CODEC_INVALID_PARAM,
                  "Profile 2 bit-depth <= 10 requires 4:2:2 color format");
    res = -1;
  }

  return res;
}